

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_read(void)

{
  _Bool _Var1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  bson_subtype_t bVar8;
  uint32_t uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  bson_oid_t *pbVar20;
  undefined8 uVar21;
  uint8_t *puVar22;
  undefined8 uVar23;
  char *pcVar24;
  char *pcVar25;
  undefined8 uVar26;
  int64_t iVar27;
  undefined8 uVar28;
  char *pcVar29;
  undefined8 uVar30;
  bson_oid_t *pbVar31;
  double dVar32;
  bson_t *third;
  bson_t *second;
  bson_t *first;
  bson_oid_t oid;
  char *json;
  
  oid.bytes._4_8_ = anon_var_dwarf_c120;
  bson_oid_init_from_string((long)&first + 4,"000000000000000000000000");
  uVar10 = bson_bcon_magic();
  iVar2 = bcon_ensure_int32(0x3035);
  uVar11 = bson_bcon_magic();
  dVar32 = bcon_ensure_double(123.456);
  uVar12 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(1);
  uVar13 = bson_bcon_magic();
  iVar4 = bcon_ensure_int32(1);
  uVar14 = bson_bcon_magic();
  iVar5 = bcon_ensure_int32(2);
  uVar15 = bson_bcon_magic();
  iVar6 = bcon_ensure_int32(3);
  uVar16 = bson_bcon_magic();
  iVar7 = bcon_ensure_int32(4);
  uVar17 = bson_bcon_magic();
  uVar18 = bson_bcon_magic();
  _Var1 = bcon_ensure_bool(true);
  uVar19 = bson_bcon_magic();
  pbVar20 = bcon_ensure_const_oid_ptr((bson_oid_t *)((long)&first + 4));
  uVar21 = bson_bcon_magic();
  bVar8 = bcon_ensure_subtype(BSON_SUBTYPE_BINARY);
  puVar22 = bcon_ensure_const_uint8_ptr((uint8_t *)"deadbeef");
  uVar9 = bcon_ensure_uint32(8);
  uVar23 = bson_bcon_magic();
  pcVar24 = bcon_ensure_const_char_ptr("foo|bar");
  pcVar25 = bcon_ensure_const_char_ptr("ism");
  uVar26 = bson_bcon_magic();
  iVar27 = bcon_ensure_int64(10000);
  uVar28 = bson_bcon_magic();
  pcVar29 = bcon_ensure_const_char_ptr("foo");
  uVar30 = bson_bcon_magic();
  pbVar31 = bcon_ensure_const_oid_ptr((bson_oid_t *)((long)&first + 4));
  bson_bcon_magic();
  bson_bcon_magic();
  bson_bcon_magic();
  bson_bcon_magic();
  bcon_ensure_int32(100);
  bcon_ensure_int32(1000);
  uVar10 = bcon_new(dVar32,0,"foo","bar","bar",uVar10,0xf,iVar2,"baz",uVar11,1,"map","{","a",uVar12,
                    0xf,iVar3,"}","array","[",uVar13,0xf,iVar4,uVar14,0xf,iVar5,uVar15,0xf,iVar6,
                    uVar16,0xf,iVar7,"]","null",uVar17,9,"boolean",uVar18,7,_Var1,"oid",uVar19,6,
                    pbVar20,"binary",uVar21,4,bVar8,puVar22,uVar9,"regex",uVar23,10,pcVar24,pcVar25,
                    "date",uVar26,8,iVar27,"ref","{","$ref",uVar28,0,pcVar29,"$id",uVar30,6,pbVar31)
  ;
  uVar11 = bcon_new(0,"after","b");
  uVar12 = bson_bcon_magic();
  _Var1 = bcon_ensure_bool(true);
  uVar12 = bcon_new(0,"twice",uVar12,7,_Var1);
  _test_bson_json_read_compare((char *)oid.bytes._4_8_,5,uVar10,uVar11,uVar12,0);
  return;
}

Assistant:

static void
test_bson_json_read (void)
{
   const char *json = "{ \n\
      \"foo\" : \"bar\", \n\
      \"bar\" : 12341, \n\
      \"baz\" : 123.456, \n\
      \"map\" : { \"a\" : 1 }, \n\
      \"array\" : [ 1, 2, 3, 4 ], \n\
      \"null\" : null, \n\
      \"boolean\" : true, \n\
      \"oid\" : { \n\
        \"$oid\" : \"000000000000000000000000\" \n\
      }, \n\
      \"binary\" : { \n\
        \"$type\" : \"00\", \n\
        \"$binary\" : \"ZGVhZGJlZWY=\" \n\
      }, \n\
      \"regex\" : { \n\
        \"$regularExpression\" : { \n\
          \"pattern\": \"foo|bar\", \"options\" : \"ism\" \n\
        } \n\
      }, \n\
      \"date\" : { \n\
        \"$date\" : \"1970-01-01T00:00:10Z\" \n\
      }, \n\
      \"ref\" : { \n\
        \"$ref\" : \"foo\", \n\
        \"$id\" : {\"$oid\": \"000000000000000000000000\"} \n\
      }, \n\
      \"undefined\" : { \n\
        \"$undefined\" : true \n\
      }, \n\
      \"minkey\" : { \n\
        \"$minKey\" : 1 \n\
      }, \n\
      \"maxkey\" : { \n\
        \"$maxKey\" : 1 \n\
      }, \n\
      \"timestamp\" : { \n\
        \"$timestamp\" : { \n\
           \"t\" : 100, \n\
           \"i\" : 1000 \n\
        } \n\
      } \n\
   } { \"after\": \"b\" } { \"twice\" : true }";

   bson_oid_t oid;
   bson_t *first, *second, *third;

   bson_oid_init_from_string (&oid, "000000000000000000000000");

   first =
      BCON_NEW ("foo",
                "bar",
                "bar",
                BCON_INT32 (12341),
                "baz",
                BCON_DOUBLE (123.456),
                "map",
                "{",
                "a",
                BCON_INT32 (1),
                "}",
                "array",
                "[",
                BCON_INT32 (1),
                BCON_INT32 (2),
                BCON_INT32 (3),
                BCON_INT32 (4),
                "]",
                "null",
                BCON_NULL,
                "boolean",
                BCON_BOOL (true),
                "oid",
                BCON_OID (&oid),
                "binary",
                BCON_BIN (BSON_SUBTYPE_BINARY, (const uint8_t *) "deadbeef", 8),
                "regex",
                BCON_REGEX ("foo|bar", "ism"),
                "date",
                BCON_DATE_TIME (10000),
                "ref",
                "{",
                "$ref",
                BCON_UTF8 ("foo"),
                "$id",
                BCON_OID (&oid),
                "}",
                "undefined",
                BCON_UNDEFINED,
                "minkey",
                BCON_MINKEY,
                "maxkey",
                BCON_MAXKEY,
                "timestamp",
                BCON_TIMESTAMP (100, 1000));

   second = BCON_NEW ("after", "b");
   third = BCON_NEW ("twice", BCON_BOOL (true));

   _test_bson_json_read_compare (json, 5, first, second, third, NULL);
}